

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O1

bool __thiscall
ON_ComponentManifestTableIndex::AddSystemItem
          (ON_ComponentManifestTableIndex *this,ON_ComponentManifestItem_PRIVATE *system_item)

{
  uint uVar1;
  bool bVar2;
  ON_ComponentManifestItem_PRIVATE **ppOVar3;
  ON_ComponentManifestItem_PRIVATE *pOVar4;
  
  if ((system_item != (ON_ComponentManifestItem_PRIVATE *)0x0) &&
     ((system_item->super_ON_ComponentManifestItem).m_component_type == this->m_component_type)) {
    uVar1 = (system_item->super_ON_ComponentManifestItem).m_index;
    if (0x80000001 < uVar1 && this->m_bIndexedComponent == true) {
      for (pOVar4 = this->m_first_system_item; pOVar4 != (ON_ComponentManifestItem_PRIVATE *)0x0;
          pOVar4 = pOVar4->m_next) {
        if ((pOVar4->super_ON_ComponentManifestItem).m_index == uVar1) {
          if (pOVar4 != (ON_ComponentManifestItem_PRIVATE *)0x0) goto LAB_003b91dd;
          break;
        }
      }
    }
    if ((this->m_component_type != Unset) && (system_item->m_manifest_table_sn == 0)) {
      bVar2 = uVar1 == 0x80000001;
      if (this->m_bIndexedComponent != false) {
        bVar2 = 0x80000001 < uVar1;
      }
      if (bVar2) {
        pOVar4 = this->m_last_system_item;
        system_item->m_prev = pOVar4;
        system_item->m_next = (ON_ComponentManifestItem_PRIVATE *)0x0;
        ppOVar3 = &pOVar4->m_next;
        if (pOVar4 == (ON_ComponentManifestItem_PRIVATE *)0x0) {
          ppOVar3 = &this->m_first_system_item;
        }
        *ppOVar3 = system_item;
        this->m_last_system_item = system_item;
        this->m_system_item_count = this->m_system_item_count + 1;
        system_item->m_manifest_table_sn = this->m_manifest_table_sn;
        return true;
      }
    }
  }
LAB_003b91dd:
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive_manifest.cpp"
             ,0xc38,"","Invalid system item parameter.");
  return false;
}

Assistant:

bool ON_ComponentManifestTableIndex::AddSystemItem(
  ON_ComponentManifestItem_PRIVATE* system_item
  )
{
  if ( nullptr != system_item
    && system_item->ComponentType() == m_component_type
    && nullptr == SystemItemFromIndex(system_item->Index())
    && 0 == system_item->m_manifest_table_sn
    && ON_ModelComponent::Type::Unset != m_component_type
    )
  {
    const bool bValidSystemComponentIndex
      = m_bIndexedComponent
      ? (system_item->Index() < 0 && system_item->Index() > ON_UNSET_INT_INDEX)
      : (ON_UNSET_INT_INDEX == system_item->Index());
    if (bValidSystemComponentIndex)
    {
      system_item->m_prev = m_last_system_item;
      system_item->m_next = nullptr;
      if (nullptr != m_last_system_item)
        m_last_system_item->m_next = system_item;
      else
        m_first_system_item = system_item;
      m_last_system_item = system_item;
      m_system_item_count++;
      system_item->m_manifest_table_sn = m_manifest_table_sn;
      return true;
    }
  }
  ON_ERROR("Invalid system item parameter.");
  return false;
}